

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

void anon_unknown.dwarf_1ba98::testFlatScanLineImage2(string *fileName)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  string *in_RDI;
  Image *img2;
  Header hdr2;
  Header hdr1;
  FlatImage img1;
  char *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  Vec2<int> *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  long local_1d0;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  Vec2<float> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Vec2<float> local_170;
  Header local_168 [63];
  undefined1 local_129 [33];
  Vec2<float> local_108;
  Header local_100 [79];
  allocator<char> local_b1;
  string local_b0 [32];
  Vec2<int> local_90;
  Vec2<int> local_88;
  Box local_80 [16];
  FlatImage local_70 [104];
  string *local_8;
  
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(&local_88,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_90,5,5);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
             in_stack_fffffffffffffe18,
             (Vec2<int> *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  Imf_3_2::FlatImage::FlatImage(local_70,local_80,ONE_LEVEL,ROUND_DOWN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Imf_3_2::Image::insertChannel((string *)local_70,(PixelType)local_b0,1,1,true);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  Imath_3_2::Vec2<float>::Vec2(&local_108,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_100,0x40,0x40,&local_108,0,3);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Imf_3_2::addComments(local_100,(string *)(local_129 + 1));
  std::__cxx11::string::~string((string *)(local_129 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  Imf_3_2::saveImage(local_8,local_100,(Image *)local_70,USE_IMAGE_DATA_WINDOW);
  this = &local_170;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_168,0x40,0x40,this,0,3);
  plVar4 = (long *)Imf_3_2::loadImage(local_8,local_168);
  if (plVar4 == (long *)0x0) {
    local_1d0 = 0;
  }
  else {
    local_1d0 = __dynamic_cast(plVar4,&Imf_3_2::Image::typeinfo,&Imf_3_2::FlatImage::typeinfo,0);
  }
  if (local_1d0 == 0) {
    __assert_fail("dynamic_cast<FlatImage*> (img2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                  ,0x3c,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
  }
  iVar3 = Imf_3_2::Image::levelMode();
  if (iVar3 != 0) {
    __assert_fail("img2->levelMode () == ONE_LEVEL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                  ,0x3d,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
  }
  iVar3 = Imf_3_2::Image::levelRoundingMode();
  if (iVar3 == 0) {
    bVar1 = Imf_3_2::Header::hasTileDescription();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!hdr2.hasTileDescription ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0x3f,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
    }
    bVar1 = Imf_3_2::hasComments(local_168);
    if ((bVar1 & 1) == 0) {
      __assert_fail("hasComments (hdr2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0x40,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
    }
    Imf_3_2::comments_abi_cxx11_(local_168);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe08);
    if (!bVar2) {
      __assert_fail("comments (hdr2) == \"it\'s raining\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0x41,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
    }
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    Imf_3_2::Header::~Header(local_168);
    Imf_3_2::Header::~Header(local_100);
    Imf_3_2::FlatImage::~FlatImage(local_70);
    return;
  }
  __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,0x3e,"void (anonymous namespace)::testFlatScanLineImage2(const string &)");
}

Assistant:

void
testFlatScanLineImage2 (const string& fileName)
{
    FlatImage img1 (Box2i (V2i (0, 0), V2i (5, 5)), ONE_LEVEL, ROUND_DOWN);
    img1.insertChannel ("H", HALF);

    Header hdr1;
    addComments (hdr1, "it's raining");

    saveImage (fileName, hdr1, img1);

    Header hdr2;
    Image* img2 = loadImage (fileName, hdr2);

    assert (dynamic_cast<FlatImage*> (img2));
    assert (img2->levelMode () == ONE_LEVEL);
    assert (img2->levelRoundingMode () == ROUND_DOWN);
    assert (!hdr2.hasTileDescription ());
    assert (hasComments (hdr2));
    assert (comments (hdr2) == "it's raining");

    delete img2;
}